

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall
kratos::VarConcat::handle_name_abi_cxx11_
          (string *__return_storage_ptr__,VarConcat *this,bool ignore_top)

{
  pointer ppVVar1;
  undefined8 this_00;
  string *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  Var **ptr;
  pointer ppVVar2;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  pointer local_98;
  pointer pcStack_90;
  undefined1 auStack_78 [8];
  string content;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  allocator<char> local_31;
  
  content.field_2._8_8_ = 0;
  ppVVar1 = (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar2 = (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 = content.field_2._8_8_,
      ppVVar2 != ppVVar1; ppVVar2 = ppVVar2 + 1) {
    (*((*ppVVar2)->super_IRNode)._vptr_IRNode[0x21])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78,
               *ppVVar2,(ulong)ignore_top);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (content.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78);
    std::__cxx11::string::~string((string *)auStack_78);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,", ",&local_31);
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)auStack_78,(string *)this_00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )0x0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
             in_R8);
  std::__cxx11::string::~string((string *)&local_98);
  local_98 = (pointer)auStack_78;
  pcStack_90 = content._M_dataplus._M_p;
  bVar3 = fmt::v7::to_string_view<char,_0>("{{{0}}}");
  format_str.data_ = (char *)bVar3.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_98;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)bVar3.data_,format_str,args);
  std::__cxx11::string::~string((string *)auStack_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&content.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string VarConcat::handle_name(bool ignore_top) const {
    std::vector<std::string> var_names;
    for (const auto &ptr : vars_) {
        var_names.emplace_back(ptr->handle_name(ignore_top));
    }
    auto content = string::join(var_names.begin(), var_names.end(), ", ");
    return ::format("{{{0}}}", content);
}